

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase331::run(TestCase331 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  undefined8 uVar5;
  short sVar6;
  undefined2 uVar7;
  undefined4 uVar8;
  char *pcVar9;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  Builder root;
  DebugComparison<capnproto_test::capnp::test::TestUnion::Union0::Which,_capnproto_test::capnp::test::TestUnion::Union0::Which>
  _kjCondition;
  undefined1 local_7f8;
  bool local_670;
  Fault f;
  undefined1 local_4d0 [2];
  undefined1 auStack_4ce [14];
  Reader local_338;
  char *local_2f0 [50];
  Builder local_160;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root,&builder.super_MessageBuilder,(StructSchema)0x6553c8);
  name_04.content.size_ = 7;
  name_04.content.ptr = "union0";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_04);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_4d0,(Builder *)&f);
  _kjCondition.left = U0F0S16;
  _kjCondition.right = U0F0S0;
  _kjCondition.op.content.ptr = (char *)((long)&__DT_RELA[0x1ca4].r_info + 7);
  name.content.size_ = 8;
  name.content.ptr = "u0f1s32";
  DynamicStruct::Builder::set((Builder *)local_4d0,name,(Reader *)&_kjCondition);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  DynamicValue::Builder::~Builder((Builder *)&f);
  name_05.content.size_ = 7;
  name_05.content.ptr = "union1";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_05);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_4d0,(Builder *)&f);
  _kjCondition.left = U0F0SP;
  _kjCondition.right = U0F0S0;
  _kjCondition.op.content.ptr = "foo";
  _kjCondition.op.content.size_ = 4;
  name_00.content.size_ = 7;
  name_00.content.ptr = "u1f1sp";
  DynamicStruct::Builder::set((Builder *)local_4d0,name_00,(Reader *)&_kjCondition);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  DynamicValue::Builder::~Builder((Builder *)&f);
  name_06.content.size_ = 7;
  name_06.content.ptr = "union2";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_06);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_4d0,(Builder *)&f);
  _kjCondition.left = U0F0S8;
  _kjCondition.right = U0F0S0;
  _kjCondition.op.content.ptr = (char *)CONCAT71(_kjCondition.op.content.ptr._1_7_,1);
  name_01.content.size_ = 7;
  name_01.content.ptr = "u2f0s1";
  DynamicStruct::Builder::set((Builder *)local_4d0,name_01,(Reader *)&_kjCondition);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  DynamicValue::Builder::~Builder((Builder *)&f);
  name_07.content.size_ = 7;
  name_07.content.ptr = "union3";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_07);
  DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((BuilderFor<DynamicStruct> *)local_4d0,(Builder *)&f);
  _kjCondition.left = U0F0S16;
  _kjCondition.right = U0F0S0;
  _kjCondition.op.content.ptr = (char *)0x112210f47de98115;
  name_02.content.size_ = 8;
  name_02.content.ptr = "u3f0s64";
  DynamicStruct::Builder::set((Builder *)local_4d0,name_02,(Reader *)&_kjCondition);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  DynamicValue::Builder::~Builder((Builder *)&f);
  DynamicStruct::Builder::asReader((Reader *)&_kjCondition,&root);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestUnion>((Schema *)&_kjCondition);
  uVar5 = _kjCondition._24_8_;
  pcVar9 = _kjCondition.op.content.ptr;
  if ((uint)_local_7f8 < 0x10) {
    _kjCondition.right = U0F0S0;
  }
  else {
    _kjCondition.right = *(Which *)_kjCondition._24_8_;
  }
  _kjCondition.left = U0F1S32;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == U0F1S32;
  if (_kjCondition.right != U0F1S32) {
    local_4d0 = (undefined1  [2])0xb;
    if ((uint)_local_7f8 < 0x10) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)uVar5;
    }
    local_2f0[0] = (char *)CONCAT62(local_2f0[0]._2_6_,uVar7);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union0::Which,capnproto_test::capnp::test::TestUnion::Union0::Which>&,capnproto_test::capnp::test::TestUnion::Union0::Which,capnproto_test::capnp::test::TestUnion::Union0::Which>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x155,FAILED,"(TestUnion::Union0::U0F1S32) == (reader.getUnion0().which())",
               "_kjCondition,TestUnion::Union0::U0F1S32, reader.getUnion0().which()",&_kjCondition,
               (Which *)local_4d0,(Which *)local_2f0);
    kj::_::Debug::Fault::fatal(&f);
  }
  _kjCondition._4_4_ = 0;
  if (0x5f < (uint)_local_7f8) {
    _kjCondition._4_4_ = *(int *)(uVar5 + 8);
  }
  _kjCondition.left = 0xd687;
  _kjCondition.right = 0x12;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition._4_4_ == 0x12d687;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    uVar8 = 0;
    f.exception._0_4_ = 0x12d687;
    if (0x5f < (uint)_local_7f8) {
      uVar8 = *(undefined4 *)(uVar5 + 8);
    }
    _local_4d0 = uVar8;
    kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x156,ERROR,
               "\"failed: expected \" \"(1234567) == (reader.getUnion0().getU0f1s32())\", _kjCondition, 1234567, reader.getUnion0().getU0f1s32()"
               ,(char (*) [64])"failed: expected (1234567) == (reader.getUnion0().getU0f1s32())",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&f,(int *)local_4d0);
  }
  if ((uint)_local_7f8 < 0x20) {
    _kjCondition.right = U0F0S0;
  }
  else {
    _kjCondition.right = *(Which *)(uVar5 + 2);
  }
  _kjCondition.left = U0F1S64;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == U0F1S64;
  if (_kjCondition.right != U0F1S64) {
    local_4d0 = (undefined1  [2])0xc;
    if ((uint)_local_7f8 < 0x20) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)(uVar5 + 2);
    }
    local_2f0[0] = (char *)CONCAT62(local_2f0[0]._2_6_,uVar7);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union1::Which,capnproto_test::capnp::test::TestUnion::Union1::Which>&,capnproto_test::capnp::test::TestUnion::Union1::Which,capnproto_test::capnp::test::TestUnion::Union1::Which>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x158,FAILED,"(TestUnion::Union1::U1F1SP) == (reader.getUnion1().which())",
               "_kjCondition,TestUnion::Union1::U1F1SP, reader.getUnion1().which()",
               (DebugComparison<capnproto_test::capnp::test::TestUnion::Union1::Which,_capnproto_test::capnp::test::TestUnion::Union1::Which>
                *)&_kjCondition,(Which *)local_4d0,(Which *)local_2f0);
    kj::_::Debug::Fault::fatal(&f);
  }
  local_2f0[0] = "foo";
  f.exception = (Exception *)pcVar9;
  _local_4d0 = (ArrayPtr<const_char>)
               capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f1sp((Reader *)&f);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)local_2f0,(Reader *)local_4d0);
  if ((local_7f8 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    f.exception = (Exception *)pcVar9;
    _local_4d0 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f1sp((Reader *)&f);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x159,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (reader.getUnion1().getU1f1sp())\", _kjCondition, \"foo\", reader.getUnion1().getU1f1sp()"
               ,(char (*) [61])"failed: expected (\"foo\") == (reader.getUnion1().getU1f1sp())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])"foo",(Reader *)local_4d0);
  }
  if ((uint)_local_7f8 < 0x30) {
    sVar6 = 0;
  }
  else {
    sVar6 = *(short *)(uVar5 + 4);
  }
  _kjCondition._0_8_ = (ulong)CONCAT42(_kjCondition._4_4_,sVar6) << 0x10;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = sVar6 == 0;
  if (sVar6 != 0) {
    auVar3._14_2_ = 0;
    auVar3._0_14_ = auStack_4ce;
    _local_4d0 = (ArrayPtr<const_char>)(auVar3 << 0x10);
    if ((uint)_local_7f8 < 0x30) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)(uVar5 + 4);
    }
    local_2f0[0] = (char *)CONCAT62(local_2f0[0]._2_6_,uVar7);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union2::Which,capnproto_test::capnp::test::TestUnion::Union2::Which>&,capnproto_test::capnp::test::TestUnion::Union2::Which,capnproto_test::capnp::test::TestUnion::Union2::Which>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x15b,FAILED,"(TestUnion::Union2::U2F0S1) == (reader.getUnion2().which())",
               "_kjCondition,TestUnion::Union2::U2F0S1, reader.getUnion2().which()",
               (DebugComparison<capnproto_test::capnp::test::TestUnion::Union2::Which,_capnproto_test::capnp::test::TestUnion::Union2::Which>
                *)&_kjCondition,(Which *)local_4d0,(Which *)local_2f0);
    kj::_::Debug::Fault::fatal(&f);
  }
  if ((uint)_local_7f8 < 0x101) {
    _kjCondition._0_8_ = (ulong)(uint7)_kjCondition._1_7_ << 8;
    if (kj::_::Debug::minSeverity < 3) goto LAB_001bd967;
LAB_001bd98e:
    if ((uint)_local_7f8 < 0x40) {
      bVar4 = true;
      _kjCondition.right = U0F0S0;
      goto LAB_001bd9a2;
    }
  }
  else {
    _kjCondition._0_8_ = CONCAT71(_kjCondition._1_7_,*(byte *)(uVar5 + 0x20)) & 0xffffffffffffff01;
    if (((*(byte *)(uVar5 + 0x20) & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
LAB_001bd967:
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"reader.getUnion2().getU2f0s1()\", _kjCondition",
                 (char (*) [48])"failed: expected reader.getUnion2().getU2f0s1()",
                 (DebugExpression<bool> *)&_kjCondition);
      goto LAB_001bd98e;
    }
  }
  _kjCondition.right = *(Which *)(uVar5 + 6);
  bVar4 = false;
LAB_001bd9a2:
  _kjCondition.left = U0F0S32;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.right == U0F0S32;
  if (_kjCondition.right != U0F0S32) {
    local_4d0 = (undefined1  [2])0x4;
    if (bVar4) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(undefined2 *)(uVar5 + 6);
    }
    local_2f0[0] = (char *)CONCAT62(local_2f0[0]._2_6_,uVar7);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union3::Which,capnproto_test::capnp::test::TestUnion::Union3::Which>&,capnproto_test::capnp::test::TestUnion::Union3::Which,capnproto_test::capnp::test::TestUnion::Union3::Which>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x15e,FAILED,"(TestUnion::Union3::U3F0S64) == (reader.getUnion3().which())",
               "_kjCondition,TestUnion::Union3::U3F0S64, reader.getUnion3().which()",
               (DebugComparison<capnproto_test::capnp::test::TestUnion::Union3::Which,_capnproto_test::capnp::test::TestUnion::Union3::Which>
                *)&_kjCondition,(Which *)local_4d0,(Which *)local_2f0);
    kj::_::Debug::Fault::fatal(&f);
  }
  if ((uint)_local_7f8 < 0x200) {
    _kjCondition.op.content.ptr = (char *)0x0;
  }
  else {
    _kjCondition.op.content.ptr = *(char **)(uVar5 + 0x38);
  }
  _kjCondition.left = 0x8115;
  _kjCondition.right = 0x7de9;
  _kjCondition._4_4_ = 0x112210f4;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3d166;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((_kjCondition.op.content.ptr != (char *)0x112210f47de98115) && (kj::_::Debug::minSeverity < 3)
     ) {
    f.exception = (Exception *)0x112210f47de98115;
    if ((uint)_local_7f8 < 0x200) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = *(char **)(uVar5 + 0x38);
    }
    _local_4d0 = pcVar9;
    kj::_::Debug::log<char_const(&)[78],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x15f,ERROR,
               "\"failed: expected \" \"(1234567890123456789ll) == (reader.getUnion3().getU3f0s64())\", _kjCondition, 1234567890123456789ll, reader.getUnion3().getU3f0s64()"
               ,(char (*) [78])
                "failed: expected (1234567890123456789ll) == (reader.getUnion3().getU3f0s64())",
               (DebugComparison<long_long,_long> *)&_kjCondition,(longlong *)&f,(long *)local_4d0);
  }
  name_08.content.size_ = 8;
  name_08.content.ptr = "u0f1s32";
  DynamicStruct::Builder::get(&local_160,&root,name_08);
  DynamicValue::Builder::~Builder(&local_160);
  auVar1[0xf] = 0;
  auVar1._0_15_ = stack0xfffffffffffffb31;
  _local_4d0 = (ArrayPtr<const_char>)(auVar1 << 8);
  kj::Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&f,(Maybe<kj::Exception> *)local_4d0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&f,(None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_4d0);
  if ((local_670 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x162,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"u0f1s32\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [89])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"u0f1s32\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  local_338.type = INT;
  local_338.field_1.floatValue = 6.0995714218929e-318;
  name_03.content.size_ = 8;
  name_03.content.ptr = "u0f1s32";
  DynamicStruct::Builder::set(&root,name_03,&local_338);
  DynamicValue::Reader::~Reader(&local_338);
  auVar2[0xf] = 0;
  auVar2._0_15_ = stack0xfffffffffffffb31;
  _local_4d0 = (ArrayPtr<const_char>)(auVar2 << 8);
  kj::Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&f,(Maybe<kj::Exception> *)local_4d0);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&f,(None *)&kj::none);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&f);
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_4d0);
  if ((local_670 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[98],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x163,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.set(\\\"u0f1s32\\\", 1234567); }) != kj::none\", _kjCondition"
               ,(char (*) [98])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.set(\"u0f1s32\", 1234567); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)&_kjCondition);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&_kjCondition)
  ;
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(DynamicApi, UnionsWrite) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestUnion>());

  root.get("union0").as<DynamicStruct>().set("u0f1s32", 1234567);
  root.get("union1").as<DynamicStruct>().set("u1f1sp", "foo");
  root.get("union2").as<DynamicStruct>().set("u2f0s1", true);
  root.get("union3").as<DynamicStruct>().set("u3f0s64", 1234567890123456789ll);

  auto reader = root.asReader().as<TestUnion>();
  ASSERT_EQ(TestUnion::Union0::U0F1S32, reader.getUnion0().which());
  EXPECT_EQ(1234567, reader.getUnion0().getU0f1s32());

  ASSERT_EQ(TestUnion::Union1::U1F1SP, reader.getUnion1().which());
  EXPECT_EQ("foo", reader.getUnion1().getU1f1sp());

  ASSERT_EQ(TestUnion::Union2::U2F0S1, reader.getUnion2().which());
  EXPECT_TRUE(reader.getUnion2().getU2f0s1());

  ASSERT_EQ(TestUnion::Union3::U3F0S64, reader.getUnion3().which());
  EXPECT_EQ(1234567890123456789ll, reader.getUnion3().getU3f0s64());

  // Can't access union members by name from the root.
  EXPECT_ANY_THROW(root.get("u0f1s32"));
  EXPECT_ANY_THROW(root.set("u0f1s32", 1234567));
}